

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O3

void bsp_move(void *payload,bsp_size_t reception_nbytes)

{
  Bsmp *pBVar1;
  pointer ppVar2;
  ulong __n;
  char *format;
  
  if ((s_spmd == (Spmd *)0x0) || (s_spmd->m_closed == true)) {
    bsp_abort("bsp_move: can only be called within SPMD section\n");
  }
  if (reception_nbytes < 0) {
    format = "bsp_move: size argument may not be negative\n";
  }
  else {
    if (reception_nbytes == 0 || payload != (void *)0x0) goto LAB_00106f5c;
    format = "bsp_move: payload may not be NULL if reception_nbytes is non-zero\n";
  }
  bsp_abort(format);
LAB_00106f5c:
  ppVar2 = (s_bsmp->m_payloads).
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((s_bsmp->m_payloads).
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start == ppVar2) {
    bsp_abort("bsp_move: Message queue was empty\n");
    ppVar2 = (s_bsmp->m_payloads).
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  pBVar1 = s_bsmp;
  __n = (long)reception_nbytes;
  if (ppVar2[-1].second < (ulong)(long)reception_nbytes) {
    __n = ppVar2[-1].second;
  }
  memcpy(payload,(void *)((long)(s_bsmp->m_payload_buffer).m_aligned_ptr + ppVar2[-1].first),__n);
  pBVar1->m_total_n_messages = pBVar1->m_total_n_messages - 1;
  ppVar2 = (pBVar1->m_payloads).
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pBVar1->m_total_payload = pBVar1->m_total_payload - ppVar2[-1].second;
  (pBVar1->m_payloads).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppVar2 + -1;
  return;
}

Assistant:

void bsp_move( void * payload, bsp_size_t reception_nbytes )
{
     if (!s_spmd || s_spmd->closed())
        bsp_abort("bsp_move: can only be called within SPMD section\n");

     if (reception_nbytes < 0 )
         bsp_abort("bsp_move: size argument may not be negative\n");

     if ( payload == NULL && reception_nbytes > 0 )
        bsp_abort("bsp_move: payload may not be NULL if reception_nbytes is non-zero\n");

     if ( s_bsmp->empty() )
         bsp_abort("bsp_move: Message queue was empty\n");

#ifdef PROFILE
     TicToc t( TicToc::BSMP, s_bsmp->payload_size() );
#endif

     size_t size = std::min< size_t >( reception_nbytes, s_bsmp->payload_size() );
     std::memcpy( payload, s_bsmp->payload(), size );
     s_bsmp->pop();
}